

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

NumberParserImpl * __thiscall
icu_63::DecimalFormat::getCurrencyParser(DecimalFormat *this,UErrorCode *status)

{
  bool bVar1;
  NumberParserImpl *__p2;
  NumberParserImpl *pNVar2;
  NumberParserImpl *ptr;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    ptr = (this->fields->atomicCurrencyParser)._M_b._M_p;
    pNVar2 = ptr;
    if (ptr == (NumberParserImpl *)0x0) {
      __p2 = numparse::impl::NumberParserImpl::createParserFromProperties
                       ((this->fields->properties).
                        super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr,
                        (this->fields->symbols).
                        super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr,true,status);
      if (__p2 == (NumberParserImpl *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      bVar1 = std::atomic<icu_63::numparse::impl::NumberParserImpl_*>::compare_exchange_strong
                        (&this->fields->atomicCurrencyParser,&ptr,__p2,memory_order_seq_cst);
      pNVar2 = __p2;
      if ((!bVar1) && (pNVar2 = ptr, __p2 != (NumberParserImpl *)0x0)) {
        (*(__p2->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[1])(__p2);
        pNVar2 = ptr;
      }
    }
  }
  else {
    pNVar2 = (NumberParserImpl *)0x0;
  }
  return pNVar2;
}

Assistant:

int32_t DecimalFormat::getMultiplier(void) const {
    if (fields->properties->multiplier != 1) {
        return fields->properties->multiplier;
    } else if (fields->properties->magnitudeMultiplier != 0) {
        return static_cast<int32_t>(uprv_pow10(fields->properties->magnitudeMultiplier));
    } else {
        return 1;
    }
}